

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inequation.cpp
# Opt level: O1

void __thiscall inequation_Linear_Test::TestBody(inequation_Linear_Test *this)

{
  _func_int **message;
  ExprPtr EVar1;
  AssertionResult gtest_ar;
  ExprPtr e;
  ExprPtr local_80;
  undefined1 local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  string local_60;
  ExprPtr local_40;
  ExprPtr local_30;
  ExprPtr local_20;
  
  mathiu::impl::operator____s((char *)&local_80,0x20f97b);
  local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = 1;
  *(undefined1 *)
   &local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[4]._M_use_count = 0;
  local_60._M_dataplus._M_p = (pointer)0x0;
  local_60._M_string_length = (size_type)operator_new(0x50);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_60._M_dataplus._M_p = (pointer)(local_60._M_string_length + 0x10);
  *(undefined4 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._M_string_length + 0x10))->
    _vptr__Sp_counted_base = 0xffffffff;
  *(undefined1 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._M_string_length + 0x40))->
    _M_use_count = 0;
  mathiu::impl::operator*((impl *)&local_40,(ExprPtr *)&local_60,&local_30);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length);
  }
  mathiu::impl::operator*((impl *)local_70,&local_80,&local_40);
  local_60._M_dataplus._M_p = (pointer)0x0;
  local_60._M_string_length = (size_type)operator_new(0x50);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_60._M_dataplus._M_p = (pointer)(local_60._M_string_length + 0x10);
  *(undefined4 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._M_string_length + 0x10))->
    _vptr__Sp_counted_base = 2;
  *(undefined1 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._M_string_length + 0x40))->
    _M_use_count = 0;
  mathiu::impl::operator<=((impl *)&local_20,(ExprPtr *)local_70,(ExprPtr *)&local_60);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  if (local_40.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_80.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  mathiu::impl::operator____s((char *)&local_40,0x20f97b);
  EVar1 = mathiu::impl::solveInequation
                    ((impl *)&local_80,&local_20,&local_40,(ExprPtr *)&mathiu::impl::true_);
  mathiu::impl::toString_abi_cxx11_
            (&local_60,(impl *)&local_80,
             (ExprPtr *)
             EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[20]>
            ((internal *)local_70,"toString(solveInequation(e, \"x\"_s))","\"(COInterval -2 inf)\"",
             &local_60,(char (*) [20])"(COInterval -2 inf)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70[0] == (impl)0x0) {
    testing::Message::Message((Message *)&local_60);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x20d5b4;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_68._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/inequation.cpp"
               ,0x2d,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_dataplus._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._M_pi
                );
  }
  if (local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(inequation, Linear)
{
    auto const e = "x"_s * -1_i <= 2_i;
    EXPECT_EQ(toString(solveInequation(e, "x"_s)), "(COInterval -2 inf)");
}